

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

bool Js::JavascriptArray::IsInlineSegment(SparseArraySegmentBase *seg,JavascriptArray *pArr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SparseArraySegmentBase **ppSVar4;
  SparseArraySegmentBase *pSVar5;
  bool local_29;
  SparseArraySegmentBase *local_28;
  SparseArraySegmentBase *inlineHeadSegment;
  JavascriptArray *pArr_local;
  SparseArraySegmentBase *seg_local;
  
  if (seg == (SparseArraySegmentBase *)0x0) {
    seg_local._7_1_ = false;
  }
  else {
    bVar2 = VarIs<Js::JavascriptNativeArray,Js::JavascriptArray>(pArr);
    if (bVar2) {
      bVar2 = VarIs<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(pArr);
      if (bVar2) {
        local_28 = &DetermineInlineHeadSegmentPointer<Js::JavascriptNativeFloatArray,0u,true>
                              ((JavascriptNativeFloatArray *)pArr)->super_SparseArraySegmentBase;
      }
      else {
        bVar2 = VarIs<Js::JavascriptNativeIntArray,Js::JavascriptArray>(pArr);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x22d,"(VarIs<JavascriptNativeIntArray>(pArr))",
                                      "VarIs<JavascriptNativeIntArray>(pArr)");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 0;
        }
        local_28 = &DetermineInlineHeadSegmentPointer<Js::JavascriptNativeIntArray,0u,true>
                              ((JavascriptNativeIntArray *)pArr)->super_SparseArraySegmentBase;
      }
      if (local_28 == (SparseArraySegmentBase *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x231,"(inlineHeadSegment)","inlineHeadSegment");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      seg_local._7_1_ = seg == local_28;
    }
    else {
      ppSVar4 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                          ((WriteBarrierPtr *)&pArr->head);
      local_29 = false;
      if (*ppSVar4 != (SparseArraySegmentBase *)0x0) {
        pSVar5 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&pArr->head);
        local_29 = HasInlineHeadSegment(pSVar5->length);
      }
      seg_local._7_1_ = local_29;
    }
  }
  return seg_local._7_1_;
}

Assistant:

bool JavascriptArray::IsInlineSegment(SparseArraySegmentBase *seg, JavascriptArray *pArr)
    {
        if (seg == nullptr)
        {
            return false;
        }

        SparseArraySegmentBase* inlineHeadSegment = nullptr;
        if (VarIs<JavascriptNativeArray>(pArr))
        {
            if (VarIs<JavascriptNativeFloatArray>(pArr))
            {
                inlineHeadSegment = DetermineInlineHeadSegmentPointer<JavascriptNativeFloatArray, 0, true>((JavascriptNativeFloatArray*)pArr);
            }
            else
            {
                AssertOrFailFast(VarIs<JavascriptNativeIntArray>(pArr));
                inlineHeadSegment = DetermineInlineHeadSegmentPointer<JavascriptNativeIntArray, 0, true>((JavascriptNativeIntArray*)pArr);
            }

            Assert(inlineHeadSegment);
            return (seg == inlineHeadSegment);
        }

        // This will result in false positives. It is used because DetermineInlineHeadSegmentPointer
        // does not handle Arrays that change type e.g. from JavascriptNativeIntArray to JavascriptArray
        // This conversion in particular is problematic because JavascriptNativeIntArray is larger than JavascriptArray
        // so the returned head segment ptr never equals pArr->head. So we will default to using this and deal with
        // false positives. It is better than always doing a hard copy.
        return pArr->head != nullptr && HasInlineHeadSegment(pArr->head->length);
    }